

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

int Lowerer::SimdGetElementCountFromBytes(ValueType arrValueType,uint8 dataWidth)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  undefined1 auVar5 [16];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a [4];
  ValueType arrValueType_local;
  
  local_1a[0] = arrValueType.field_0;
  if (3 < (byte)(dataWidth * '@' | (byte)(dataWidth - 4) >> 2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3b72,
                       "(dataWidth == 4 || dataWidth == 8 || dataWidth == 12 || dataWidth == 16)",
                       "dataWidth == 4 || dataWidth == 8 || dataWidth == 12 || dataWidth == 16");
    if (!bVar2) goto LAB_005dd049;
    *puVar4 = 0;
  }
  bVar2 = ValueType::IsTypedArray((ValueType *)&local_1a[0].field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3b73,"(arrValueType.IsTypedArray())","arrValueType.IsTypedArray()");
    if (!bVar2) {
LAB_005dd049:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = GetArrayIndirScale((ValueType)local_1a[0].field_0);
  auVar5 = ZEXT416((uint)((float)dataWidth / (float)(1 << (bVar3 & 0x1f) & 0xff)));
  auVar5 = roundss(auVar5,auVar5,10);
  return (int)auVar5._0_4_;
}

Assistant:

int Lowerer::SimdGetElementCountFromBytes(ValueType arrValueType, uint8 dataWidth)
{
    Assert(dataWidth == 4 || dataWidth == 8 || dataWidth == 12 || dataWidth == 16);
    Assert(arrValueType.IsTypedArray());
    BYTE bpe = 1 << Lowerer::GetArrayIndirScale(arrValueType);

    // round up
    return (int)::ceil(((float)dataWidth) / bpe);
}